

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnqueueProcessedObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **list,
          void *objectAddress,uint index)

{
  HeapBlockType HVar1;
  code *pcVar2;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  ushort uVar7;
  undefined4 *puVar8;
  byte *pbVar9;
  uint i;
  int __c;
  uchar retval;
  
  uVar7 = GetAddressIndex(this,objectAddress);
  if (uVar7 != index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x658,"(GetAddressIndex(objectAddress) == index)",
                       "GetAddressIndex(objectAddress) == index");
    if (!bVar6) goto LAB_006ad92e;
    *puVar8 = 0;
  }
  if (index == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65a,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar6) goto LAB_006ad92e;
    *puVar8 = 0;
  }
  if (this->objectCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65b,"(this->objectCount != 1)","this->objectCount != 1");
    if (!bVar6) goto LAB_006ad92e;
    *puVar8 = 0;
  }
  if (&this->freeObjectList == list) {
    if (((ulong)objectAddress & 0xf) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                         "HeapInfo::IsAlignedAddress(objectAddress)");
      if (!bVar6) goto LAB_006ad92e;
      *puVar8 = 0;
    }
    uVar4 = (uint)((ulong)objectAddress >> 4);
    i = uVar4 & 0x7ff;
    BVStatic<2048UL>::AssertRange(&this->debugFreeBits,i);
    pbVar3 = (byte *)((long)&(this->debugFreeBits).data[0].word + ((long)(int)i >> 3));
    uVar4 = uVar4 & 7;
    bVar5 = *pbVar3;
    *pbVar3 = *pbVar3 | '\x01' << uVar4;
    if ((bVar5 >> uVar4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x661,"(!isSet)","!isSet");
      if (!bVar6) {
LAB_006ad92e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  if (this->heapBucket->heapInfo->recycler->verifyEnabled == false) {
    HVar1 = (this->super_HeapBlock).heapBlockType;
    if ((HVar1 == SmallLeafBlockType) || (HVar1 == MediumLeafBlockType)) goto LAB_006ad8c7;
    __c = 0;
  }
  else {
    __c = 0xca;
  }
  memset(objectAddress,__c,(ulong)this->objectSize);
LAB_006ad8c7:
  FreeObject::SetNext((FreeObject *)objectAddress,*list);
  *list = (FreeObject *)objectAddress;
  if ((DAT_015d641e == '\x01') && (DAT_015ca846 == '\x01')) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[4])(this,objectAddress);
  }
  pbVar9 = ObjectInfo(this,index);
  *pbVar9 = '\0';
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::EnqueueProcessedObject(FreeObject ** list, void* objectAddress, uint index)
{
    Assert(GetAddressIndex(objectAddress) == index);

    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
    Assert(this->objectCount != 1);

#if DBG || defined(RECYCLER_STATS)
    if (list == &this->freeObjectList)
    {
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(objectAddress));
        Assert(!isSet);
    }
#endif
    FillFreeMemory(objectAddress, objectSize);

    FreeObject * freeObject = (FreeObject *)objectAddress;
    freeObject->SetNext(*list);
    *list = freeObject;

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(RecyclerVerifyMark))
    {
        this->WBClearObject((char*)objectAddress);
    }
#endif

    // clear the attributes so that when we are allocating a leaf, we don't have to set the attribute
    this->ObjectInfo(index) = 0;
}